

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-pipe-connect-multiple.c
# Opt level: O2

int run_test_pipe_connect_close_multiple(void)

{
  int iVar1;
  uv_loop_t *loop;
  undefined8 uVar2;
  char *pcVar3;
  char *pcVar4;
  long lVar5;
  client_t *pcVar6;
  bool bVar7;
  int64_t eval_b;
  int64_t eval_a;
  
  loop = (uv_loop_t *)uv_default_loop();
  iVar1 = uv_pipe_init(loop,&server_handle,0);
  eval_a = (int64_t)iVar1;
  eval_b = 0;
  if (eval_a == 0) {
    iVar1 = uv_pipe_bind(&server_handle,"/tmp/uv-test-sock");
    eval_a = (int64_t)iVar1;
    eval_b = 0;
    if (eval_a == 0) {
      iVar1 = uv_listen(&server_handle,0x80,connection_cb2);
      eval_a = (int64_t)iVar1;
      eval_b = 0;
      if (eval_a == 0) {
        lVar5 = 10;
        pcVar6 = clients;
        while (bVar7 = lVar5 != 0, lVar5 = lVar5 + -1, bVar7) {
          iVar1 = uv_pipe_init(loop,pcVar6,0);
          eval_a = (int64_t)iVar1;
          eval_b = 0;
          if (eval_a != 0) {
            pcVar4 = "0";
            pcVar3 = "r";
            uVar2 = 0x9f;
            goto LAB_00160ed1;
          }
          uv_pipe_connect(&pcVar6->conn_req,pcVar6,"/tmp/uv-test-sock",connect_cb2);
          pcVar6 = pcVar6 + 1;
        }
        for (lVar5 = 0; lVar5 != 0xd20; lVar5 = lVar5 + 0x150) {
          uv_close((long)&clients[0].pipe_handle.data + lVar5);
        }
        uv_run(loop,0);
        eval_a = (int64_t)connection_cb_called;
        eval_b = 10;
        if (eval_a == 10) {
          eval_a = (int64_t)connect_cb_called;
          eval_b = 10;
          if (eval_a == 10) {
            close_loop(loop);
            eval_a = 0;
            iVar1 = uv_loop_close(loop);
            eval_b = (int64_t)iVar1;
            if (eval_b == 0) {
              uv_library_shutdown();
              return 0;
            }
            pcVar4 = "uv_loop_close(loop)";
            pcVar3 = "0";
            uVar2 = 0xb0;
          }
          else {
            pcVar4 = "10";
            pcVar3 = "connect_cb_called";
            uVar2 = 0xae;
          }
        }
        else {
          pcVar4 = "10";
          pcVar3 = "connection_cb_called";
          uVar2 = 0xad;
        }
      }
      else {
        pcVar4 = "0";
        pcVar3 = "r";
        uVar2 = 0x9b;
      }
    }
    else {
      pcVar4 = "0";
      pcVar3 = "r";
      uVar2 = 0x98;
    }
  }
  else {
    pcVar4 = "0";
    pcVar3 = "r";
    uVar2 = 0x95;
  }
LAB_00160ed1:
  fprintf(_stderr,"Assertion failed in %s on line %d: `%s %s %s` (%ld %s %ld)\n",
          "/workspace/llm4binary/github/license_all_cmakelists_1510/JuliaLang[P]libuv/test/test-pipe-connect-multiple.c"
          ,uVar2,pcVar3,"==",pcVar4,eval_a,"==",eval_b);
  abort();
}

Assistant:

TEST_IMPL(pipe_connect_close_multiple) {
#if defined(NO_SELF_CONNECT)
  RETURN_SKIP(NO_SELF_CONNECT);
#endif
  int i;
  int r;
  uv_loop_t* loop;

  loop = uv_default_loop();

  r = uv_pipe_init(loop, &server_handle, 0);
  ASSERT_OK(r);

  r = uv_pipe_bind(&server_handle, TEST_PIPENAME);
  ASSERT_OK(r);

  r = uv_listen((uv_stream_t*)&server_handle, 128, connection_cb2);
  ASSERT_OK(r);

  for (i = 0; i < NUM_CLIENTS; i++) {
    r = uv_pipe_init(loop, &clients[i].pipe_handle, 0);
    ASSERT_OK(r);
    uv_pipe_connect(&clients[i].conn_req,
                    &clients[i].pipe_handle,
                    TEST_PIPENAME,
                    connect_cb2);
  }

  for (i = 0; i < NUM_CLIENTS; i++) {
    uv_close((uv_handle_t*)&clients[i].pipe_handle, NULL);
  }


  uv_run(loop, UV_RUN_DEFAULT);

  ASSERT_EQ(connection_cb_called, NUM_CLIENTS);
  ASSERT_EQ(connect_cb_called, NUM_CLIENTS);

  MAKE_VALGRIND_HAPPY(loop);
  return 0;
}